

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  Ch *pCVar4;
  char *pcVar5;
  Ch *pCVar6;
  Number NVar7;
  double dVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar16;
  byte *pbVar17;
  undefined4 uVar18;
  ulong uVar19;
  char *pcVar20;
  uint16_t uVar21;
  SizeType SVar22;
  byte *pbVar23;
  ushort uVar24;
  int iVar25;
  byte bVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined4 uStack_48;
  uint uStack_44;
  
  bVar2 = *is->src_;
  if (bVar2 < 0x6e) {
    if (bVar2 == 0x22) {
      ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                (this,is,handler,false);
      return;
    }
    if (bVar2 != 0x5b) {
      if (bVar2 != 0x66) {
        ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  (this,is,handler);
        return;
      }
      pcVar5 = is->src_;
      if (*pcVar5 != 'f') {
        __assert_fail("is.Peek() == \'f\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x372,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      pcVar20 = pcVar5 + 1;
      is->src_ = pcVar20;
      if (pcVar5[1] == 'a') {
        pcVar20 = pcVar5 + 2;
        is->src_ = pcVar20;
        if (pcVar5[2] == 'l') {
          pcVar20 = pcVar5 + 3;
          is->src_ = pcVar20;
          if (pcVar5[3] == 's') {
            pcVar20 = pcVar5 + 4;
            is->src_ = pcVar20;
            if (pcVar5[4] == 'e') {
              is->src_ = pcVar5 + 5;
              pGVar16 = internal::Stack<rapidjson::CrtAllocator>::
                        Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                                  (&handler->stack_,1);
              (pGVar16->data_).n = (Number)0x0;
              (pGVar16->data_).s.str = (Ch *)0x0;
              (pGVar16->data_).f.flags = 9;
              return;
            }
          }
        }
      }
      if (*(int *)(this + 0x30) == 0) {
        pCVar6 = is->head_;
        *(undefined4 *)(this + 0x30) = 3;
        *(long *)(this + 0x38) = (long)pcVar20 - (long)pCVar6;
        return;
      }
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x37a,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x328,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar16 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar16->data_).n = (Number)0x0;
    (pGVar16->data_).s.str = (Ch *)0x0;
    (pGVar16->data_).f.flags = 4;
    pbVar17 = (byte *)is->src_;
    while (((ulong)*pbVar17 < 0x21 && ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0))) {
      pbVar17 = pbVar17 + 1;
    }
    is->src_ = (Ch *)pbVar17;
    if (*(int *)(this + 0x30) == 0) {
      if (*pbVar17 == 0x5d) {
        is->src_ = (Ch *)(pbVar17 + 1);
        bVar11 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndArray(handler,0);
        if (!bVar11) {
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                          ,0x333,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
LAB_006446a4:
          pbVar17 = (byte *)is->src_;
          uVar18 = 0x10;
LAB_006446ac:
          pCVar6 = is->head_;
          *(undefined4 *)(this + 0x30) = uVar18;
          *(long *)(this + 0x38) = (long)pbVar17 - (long)pCVar6;
        }
      }
      else {
        SVar22 = 0;
        do {
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar17 = (byte *)is->src_;
          while (((ulong)*pbVar17 < 0x21 && ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0)))
          {
            pbVar17 = pbVar17 + 1;
          }
          is->src_ = (Ch *)pbVar17;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SVar22 = SVar22 + 1;
          if (*pbVar17 != 0x2c) {
            if (*pbVar17 != 0x5d) {
              uVar18 = 7;
              goto LAB_006446ac;
            }
            is->src_ = (Ch *)(pbVar17 + 1);
            bVar11 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::EndArray(handler,SVar22);
            if (bVar11) {
              return;
            }
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                            ,0x345,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            goto LAB_006446a4;
          }
          pbVar17 = pbVar17 + 1;
          is->src_ = (Ch *)pbVar17;
          while (((ulong)*pbVar17 < 0x21 && ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0)))
          {
            pbVar17 = pbVar17 + 1;
          }
          is->src_ = (Ch *)pbVar17;
        } while (*(int *)(this + 0x30) == 0);
      }
    }
    return;
  }
  if (bVar2 == 0x7b) {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x2e4,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    pGVar16 = internal::Stack<rapidjson::CrtAllocator>::
              Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                        (&handler->stack_,1);
    (pGVar16->data_).n = (Number)0x0;
    (pGVar16->data_).s.str = (Ch *)0x0;
    (pGVar16->data_).f.flags = 3;
    pbVar17 = (byte *)is->src_;
    while (((ulong)*pbVar17 < 0x21 && ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0))) {
      pbVar17 = pbVar17 + 1;
    }
    is->src_ = (Ch *)pbVar17;
    if (*(int *)(this + 0x30) == 0) {
      if (*pbVar17 == 0x7d) {
        is->src_ = (Ch *)(pbVar17 + 1);
        bVar11 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::EndObject(handler,0);
        if (bVar11) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                        ,0x2ef,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
LAB_00644505:
        pbVar17 = (byte *)is->src_;
        uVar18 = 0x10;
      }
      else {
        if (*pbVar17 == 0x22) {
          SVar22 = 0;
          do {
            ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler,true);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pbVar17 = (byte *)is->src_;
            while (((ulong)*pbVar17 < 0x21 && ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0))
                  ) {
              pbVar17 = pbVar17 + 1;
            }
            is->src_ = (Ch *)pbVar17;
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            if (*pbVar17 != 0x3a) {
              uVar18 = 5;
              goto LAB_00644556;
            }
            pbVar17 = pbVar17 + 1;
            is->src_ = (Ch *)pbVar17;
            while (((ulong)*pbVar17 < 0x21 && ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0))
                  ) {
              pbVar17 = pbVar17 + 1;
            }
            is->src_ = (Ch *)pbVar17;
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                      (this,is,handler);
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            pbVar17 = (byte *)is->src_;
            while (((ulong)*pbVar17 < 0x21 && ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0))
                  ) {
              pbVar17 = pbVar17 + 1;
            }
            is->src_ = (Ch *)pbVar17;
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
            SVar22 = SVar22 + 1;
            if (*pbVar17 != 0x2c) {
              if (*pbVar17 != 0x7d) {
                uVar18 = 6;
                goto LAB_00644556;
              }
              is->src_ = (Ch *)(pbVar17 + 1);
              bVar11 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                       ::EndObject(handler,SVar22);
              if (bVar11) {
                return;
              }
              if (*(int *)(this + 0x30) != 0) {
                __assert_fail("!HasParseError()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                              ,0x314,
                              "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                             );
              }
              goto LAB_00644505;
            }
            pbVar17 = pbVar17 + 1;
            is->src_ = (Ch *)pbVar17;
            while (((ulong)*pbVar17 < 0x21 && ((0x100002600U >> ((ulong)*pbVar17 & 0x3f) & 1) != 0))
                  ) {
              pbVar17 = pbVar17 + 1;
            }
            is->src_ = (Ch *)pbVar17;
            if (*(int *)(this + 0x30) != 0) {
              return;
            }
          } while (*pbVar17 == 0x22);
        }
        uVar18 = 4;
      }
LAB_00644556:
      pCVar6 = is->head_;
      *(undefined4 *)(this + 0x30) = uVar18;
      *(long *)(this + 0x38) = (long)pbVar17 - (long)pCVar6;
    }
    return;
  }
  if (bVar2 == 0x74) {
    pcVar5 = is->src_;
    if (*pcVar5 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x365,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pcVar20 = pcVar5 + 1;
    is->src_ = pcVar20;
    if (pcVar5[1] == 'r') {
      pcVar20 = pcVar5 + 2;
      is->src_ = pcVar20;
      if (pcVar5[2] == 'u') {
        pcVar20 = pcVar5 + 3;
        is->src_ = pcVar20;
        if (pcVar5[3] == 'e') {
          is->src_ = pcVar5 + 4;
          pGVar16 = internal::Stack<rapidjson::CrtAllocator>::
                    Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                              (&handler->stack_,1);
          (pGVar16->data_).n = (Number)0x0;
          (pGVar16->data_).s.str = (Ch *)0x0;
          (pGVar16->data_).f.flags = 10;
          return;
        }
      }
    }
    if (*(int *)(this + 0x30) == 0) {
      pCVar6 = is->head_;
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pcVar20 - (long)pCVar6;
      return;
    }
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                  ,0x36d,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  if (bVar2 == 0x6e) {
    ParseNull<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pbVar3 = (byte *)is->src_;
  pCVar6 = is->head_;
  bVar2 = *pbVar3;
  pbVar17 = pbVar3;
  bVar26 = bVar2;
  if (bVar2 == 0x2d) {
    pbVar17 = pbVar3 + 1;
    bVar26 = pbVar3[1];
  }
  pCVar4 = is->dst_;
  if (bVar26 == 0x30) {
    uVar27 = (uint)pbVar17[1];
    pbVar17 = pbVar17 + 1;
    dVar8 = 0.0;
    bVar11 = false;
    bVar10 = false;
    iVar12 = 0;
    uVar29 = 0;
    bVar9 = false;
    uVar28 = 0;
    goto LAB_002d4d2e;
  }
  if ((byte)(bVar26 - 0x31) < 9) {
    uVar28 = bVar26 - 0x30;
    bVar26 = pbVar17[1];
    uVar19 = (ulong)bVar26;
    pbVar17 = pbVar17 + 1;
    dVar8 = 0.0;
    if (bVar2 == 0x2d) {
      if ((byte)(bVar26 - 0x30) < 10) {
        iVar12 = 0;
LAB_002d4b8b:
        if (uVar28 < 0xccccccc) {
LAB_002d4b94:
          uVar28 = (uVar28 * 10 + (int)uVar19) - 0x30;
          iVar12 = iVar12 + 1;
          bVar26 = pbVar17[1];
          uVar19 = (ulong)bVar26;
          pbVar17 = pbVar17 + 1;
          if (9 < (byte)(bVar26 - 0x30)) goto LAB_002d4c68;
          goto LAB_002d4b8b;
        }
        if (uVar28 != 0xccccccc) goto LAB_002d4c0c;
        if ((byte)uVar19 < 0x39) goto LAB_002d4b94;
        uVar28 = 0xccccccc;
        uVar19 = 0x39;
LAB_002d4c0c:
        uVar29 = (ulong)uVar28;
        if (bVar2 == 0x2d) {
          do {
            if ((0xccccccccccccccb < uVar29) && (0x38 < (byte)uVar19 || uVar29 != 0xccccccccccccccc)
               ) goto LAB_002d4cba;
            uVar29 = (uVar19 & 0xf) + uVar29 * 10;
            iVar12 = iVar12 + 1;
            bVar26 = pbVar17[1];
            uVar19 = (ulong)bVar26;
            pbVar17 = pbVar17 + 1;
          } while ((byte)(bVar26 - 0x30) < 10);
        }
        else {
          do {
            if ((0x1999999999999998 < uVar29) &&
               (0x35 < (byte)uVar19 || uVar29 != 0x1999999999999999)) goto LAB_002d4cba;
            uVar29 = (uVar19 & 0xf) + uVar29 * 10;
            iVar12 = iVar12 + 1;
            bVar26 = pbVar17[1];
            uVar19 = (ulong)bVar26;
            pbVar17 = pbVar17 + 1;
          } while ((byte)(bVar26 - 0x30) < 10);
        }
        uVar27 = (uint)bVar26;
        dVar8 = 0.0;
        bVar9 = true;
        bVar11 = false;
        bVar10 = false;
        goto LAB_002d4d2e;
      }
LAB_002d4fa7:
      iVar12 = 0;
    }
    else {
      if (9 < (byte)(bVar26 - 0x30)) goto LAB_002d4fa7;
      iVar12 = 0;
      do {
        if (0x19999998 < uVar28) {
          if (uVar28 != 0x19999999) goto LAB_002d4c0c;
          if (0x35 < (byte)uVar19) {
            uVar28 = 0x19999999;
            goto LAB_002d4c0c;
          }
        }
        uVar28 = (uVar28 * 10 + (int)uVar19) - 0x30;
        iVar12 = iVar12 + 1;
        bVar26 = pbVar17[1];
        uVar19 = (ulong)bVar26;
        pbVar17 = pbVar17 + 1;
      } while ((byte)(bVar26 - 0x30) < 10);
    }
LAB_002d4c68:
    uVar27 = (uint)bVar26;
    bVar11 = false;
    bVar10 = false;
    uVar29 = 0;
    bVar9 = false;
    goto LAB_002d4d2e;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                  ,0x5fd,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar15 = (long)pbVar17 - (long)pCVar6;
  *(undefined4 *)(this + 0x30) = 3;
LAB_002d4f9e:
  *(long *)(this + 0x38) = lVar15;
  goto LAB_002d51f7;
LAB_002d4f63:
  do {
    pbVar23 = pbVar17 + 1;
    pbVar17 = pbVar17 + 1;
  } while ((byte)(*pbVar23 - 0x30) < 10);
LAB_002d5018:
  iVar12 = -iVar13;
  if (!bVar11) {
    iVar12 = iVar13;
  }
LAB_002d5024:
  if (!bVar10) {
    if (bVar9) {
      if (bVar2 == 0x2d) {
        bVar11 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Int64(handler,-uVar29);
        if (!bVar11) {
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                          ,0x6b6,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          *(undefined4 *)(this + 0x30) = 0x10;
          *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar6;
        }
      }
      else {
        pGVar16 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        (pGVar16->data_).s.str = (Ch *)0x0;
        *(ulong *)&pGVar16->data_ = uVar29;
        uVar24 = (ushort)((uVar29 & 0xffffffff80000000) == 0) << 5 | 0x1d6;
        if (uVar29 >> 0x20 != 0) {
          uVar24 = (ushort)(-1 < (long)uVar29) << 7 | 0x116;
        }
        (pGVar16->data_).f.flags = uVar24;
      }
    }
    else if (bVar2 == 0x2d) {
      pGVar16 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar16->data_).s.str = (Ch *)0x0;
      *(long *)&pGVar16->data_ = (long)(int)-uVar28;
      uVar21 = 0xb6;
      if ((int)uVar28 < 1) {
        uVar21 = 0x1f6;
      }
      (pGVar16->data_).f.flags = uVar21;
    }
    else {
      pGVar16 = internal::Stack<rapidjson::CrtAllocator>::
                Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                          (&handler->stack_,1);
      (pGVar16->data_).s.str = (Ch *)0x0;
      *(ulong *)&pGVar16->data_ = uVar19;
      (pGVar16->data_).f.flags = (ushort)(-1 < (int)uVar28) << 5 | 0x1d6;
    }
    goto LAB_002d51f7;
  }
  goto LAB_002d5029;
LAB_002d4cba:
  auVar31._8_4_ = (int)(uVar29 >> 0x20);
  auVar31._0_8_ = uVar29;
  auVar31._12_4_ = 0x45300000;
  dVar8 = (auVar31._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar29) - 4503599627370496.0);
  do {
    if (1.7976931348623158e+307 <= dVar8) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x61e,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      goto LAB_002d5006;
    }
    dVar8 = dVar8 * 10.0 + (double)((int)uVar19 + -0x30);
    bVar26 = pbVar17[1];
    uVar19 = (ulong)bVar26;
    uVar27 = (uint)bVar26;
    pbVar17 = pbVar17 + 1;
  } while ((byte)(bVar26 - 0x30) < 10);
  bVar11 = true;
  bVar10 = true;
  bVar9 = true;
LAB_002d4d2e:
  uVar19 = (ulong)uVar28;
  if ((char)uVar27 != '.') {
    iVar25 = 0;
LAB_002d4eaa:
    iVar12 = 0;
    if ((uVar27 | 0x20) == 0x65) {
      uVar14 = uVar19;
      if (bVar9) {
        uVar14 = uVar29;
      }
      if (!bVar10) {
        auVar33._8_4_ = (int)(uVar14 >> 0x20);
        auVar33._0_8_ = uVar14;
        auVar33._12_4_ = 0x45300000;
        dVar8 = (auVar33._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar14) - 4503599627370496.0);
        bVar10 = true;
      }
      bVar26 = pbVar17[1];
      bVar11 = bVar26 != 0x2b;
      if ((bVar11) && (bVar26 != 0x2d)) {
        if (9 < (byte)(bVar26 - 0x30)) {
          pbVar17 = pbVar17 + 1;
LAB_002d4f7e:
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                          ,0x676,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          lVar15 = (long)pbVar17 - (long)pCVar6;
          *(undefined4 *)(this + 0x30) = 0xf;
          goto LAB_002d4f9e;
        }
        pbVar17 = pbVar17 + 2;
        iVar13 = bVar26 - 0x30;
      }
      else {
        pbVar23 = pbVar17 + 2;
        if (9 < (byte)(*pbVar23 - 0x30)) {
          pbVar17 = pbVar17 + 2;
          goto LAB_002d4f7e;
        }
        pbVar17 = pbVar17 + 3;
        iVar13 = *pbVar23 - 0x30;
        if (bVar26 != 0x2b) {
          bVar26 = *pbVar17;
          if ((byte)(bVar26 - 0x30) < 10) {
            do {
              iVar13 = iVar13 * 10 + (uint)bVar26 + -0x30;
              if (0xccccccb < iVar13) goto LAB_002d4f63;
              pbVar17 = pbVar17 + 1;
              bVar26 = *pbVar17;
            } while ((byte)(bVar26 - 0x30) < 10);
          }
          else {
            bVar11 = true;
          }
          goto LAB_002d5018;
        }
      }
      do {
        bVar26 = *pbVar17;
        if (9 < (byte)(bVar26 - 0x30)) {
          bVar11 = false;
          goto LAB_002d5018;
        }
        pbVar17 = pbVar17 + 1;
        iVar13 = iVar13 * 10 + (uint)bVar26 + -0x30;
      } while (iVar13 <= 0x134 - iVar25);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x671,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
LAB_002d5006:
      *(undefined4 *)(this + 0x30) = 0xd;
      *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar6;
      goto LAB_002d51f7;
    }
    goto LAB_002d5024;
  }
  uVar27 = (uint)pbVar17[1];
  pbVar23 = pbVar17 + 1;
  if ((byte)(pbVar17[1] - 0x3a) < 0xf6) {
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x62a,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 0xe;
    *(long *)(this + 0x38) = (long)pbVar23 - (long)pCVar6;
    pbVar17 = pbVar23;
    goto LAB_002d51f7;
  }
  iVar25 = 0;
  if (bVar11) {
LAB_002d4de0:
    do {
      pbVar17 = pbVar23;
      if (0x39 < (byte)uVar27) goto LAB_002d4eaa;
      if (iVar12 < 0x11) {
        dVar8 = dVar8 * 10.0 + (double)(int)(uVar27 - 0x30);
        iVar25 = iVar25 + -1;
        if (0.0 < dVar8) {
          iVar12 = iVar12 + 1;
        }
      }
      pbVar1 = pbVar23 + 1;
      uVar27 = (uint)*pbVar1;
      pbVar17 = pbVar23 + 1;
      pbVar23 = pbVar17;
    } while ('/' < (char)*pbVar1);
    iVar12 = 0;
    goto LAB_002d5024;
  }
  if (!bVar9) {
    uVar29 = uVar19;
  }
  iVar25 = 0;
  do {
    if ((0x39 < (byte)uVar27) || (uVar29 >> 0x35 != 0)) {
      auVar32._8_4_ = (int)(uVar29 >> 0x20);
      auVar32._0_8_ = uVar29;
      auVar32._12_4_ = 0x45300000;
      dVar8 = (auVar32._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar29) - 4503599627370496.0);
      bVar10 = true;
      goto LAB_002d4de0;
    }
    pbVar17 = pbVar23 + 1;
    iVar25 = iVar25 + -1;
    uVar29 = (ulong)(uVar27 - 0x30) + uVar29 * 10;
    iVar12 = iVar12 + (uint)(uVar29 != 0);
    pbVar1 = pbVar23 + 1;
    uVar27 = (uint)*pbVar1;
    pbVar23 = pbVar17;
  } while ('/' < (char)*pbVar1);
  dVar8 = (double)(long)uVar29;
  iVar12 = 0;
LAB_002d5029:
  uVar27 = iVar12 + iVar25;
  if ((int)uVar27 < -0x134) {
    dVar30 = 0.0;
    if (0xfffffd97 < uVar27) {
      dVar30 = (dVar8 / 1e+308) /
               *(double *)(internal::Pow10(int)::e + (ulong)(-uVar27 - 0x134) * 8);
    }
  }
  else if ((int)uVar27 < 0) {
    dVar30 = dVar8 / *(double *)(internal::Pow10(int)::e + (ulong)-uVar27 * 8);
  }
  else {
    if (0x134 < uVar27) {
      __assert_fail("n >= 0 && n <= 308",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/rapidjson/include/rapidjson/internal/pow10.h"
                    ,0x30,"double rapidjson::internal::Pow10(int)");
    }
    dVar30 = dVar8 * *(double *)(internal::Pow10(int)::e + (ulong)uVar27 * 8);
  }
  pGVar16 = internal::Stack<rapidjson::CrtAllocator>::
            Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                      (&handler->stack_,1);
  uStack_48 = SUB84(dVar30,0);
  uStack_44 = (uint)((ulong)dVar30 >> 0x20);
  if (bVar2 == 0x2d) {
    uStack_44 = uStack_44 ^ 0x80000000;
  }
  (pGVar16->data_).s.str = (Ch *)0x216000000000000;
  NVar7.u64._4_4_ = uStack_44;
  NVar7.i.i = uStack_48;
  (pGVar16->data_).n = NVar7;
LAB_002d51f7:
  is->src_ = (Ch *)pbVar17;
  is->dst_ = pCVar4;
  is->head_ = pCVar6;
  return;
}

Assistant:

Ch Peek() { return *src_; }